

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  uint8_t *puVar1;
  bool bVar2;
  Nullable<const_char_*> failure_msg;
  uint8_t *puVar3;
  undefined7 extraout_var;
  unsigned_long uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar5;
  ulong uVar6;
  pair<unsigned_long,_bool> pVar7;
  uint64_t temp;
  uint8_t local_21;
  LogMessageFatal local_20;
  
  puVar3 = this->buffer_;
  puVar1 = this->buffer_end_;
  if (((int)puVar1 - (int)puVar3 < 10) && ((puVar1 <= puVar3 || ((char)puVar1[-1] < '\0')))) {
    bVar2 = ReadVarint64Slow(this,(uint64_t *)&local_20);
    uVar6 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
    uVar4 = CONCAT44(local_20.super_LogMessage._4_4_,
                     local_20.super_LogMessage.errno_saver_.saved_errno_);
  }
  else {
    local_21 = *puVar3;
    local_20.super_LogMessage.errno_saver_.saved_errno_ = 0x80;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_char,int>
                            (&local_21,(int *)&local_20,"buffer[0] >= 128");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1da,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
    }
    if ((char)puVar3[1] < '\0') {
      if ((char)puVar3[2] < '\0') {
        if ((char)puVar3[3] < '\0') {
          if ((char)puVar3[4] < '\0') {
            if ((char)puVar3[5] < '\0') {
              if ((char)puVar3[6] < '\0') {
                if ((char)puVar3[7] < '\0') {
                  if ((char)puVar3[8] < '\0') {
                    if ((char)puVar3[9] < '\0') {
                      uVar4 = 0;
                      uVar6 = 0;
                      goto LAB_0038525b;
                    }
                    puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<10ul>
                                       (puVar3,(uint64_t *)&local_20);
                    uVar5 = extraout_RDX_07;
                  }
                  else {
                    puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<9ul>
                                       (puVar3,(uint64_t *)&local_20);
                    uVar5 = extraout_RDX_06;
                  }
                }
                else {
                  puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<8ul>
                                     (puVar3,(uint64_t *)&local_20);
                  uVar5 = extraout_RDX_05;
                }
              }
              else {
                puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<7ul>
                                   (puVar3,(uint64_t *)&local_20);
                uVar5 = extraout_RDX_04;
              }
            }
            else {
              puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<6ul>
                                 (puVar3,(uint64_t *)&local_20);
              uVar5 = extraout_RDX_03;
            }
          }
          else {
            puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<5ul>
                               (puVar3,(uint64_t *)&local_20);
            uVar5 = extraout_RDX_02;
          }
        }
        else {
          puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<4ul>
                             (puVar3,(uint64_t *)&local_20);
          uVar5 = extraout_RDX_01;
        }
      }
      else {
        puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<3ul>
                           (puVar3,(uint64_t *)&local_20);
        uVar5 = extraout_RDX_00;
      }
    }
    else {
      puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<2ul>(puVar3,(uint64_t *)&local_20)
      ;
      uVar5 = extraout_RDX;
    }
    this->buffer_ = puVar3;
    uVar6 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
    uVar4 = CONCAT44(local_20.super_LogMessage._4_4_,
                     local_20.super_LogMessage.errno_saver_.saved_errno_);
  }
LAB_0038525b:
  pVar7._8_8_ = uVar6;
  pVar7.first = uVar4;
  return pVar7;
}

Assistant:

std::pair<uint64_t, bool> CodedInputStream::ReadVarint64Fallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first) {
      return std::make_pair(0, false);
    }
    buffer_ = p.second;
    return std::make_pair(temp, true);
  } else {
    uint64_t temp;
    bool success = ReadVarint64Slow(&temp);
    return std::make_pair(temp, success);
  }
}